

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitSop.c
# Opt level: O0

void Kit_SopCreate(Kit_Sop_t *cResult,Vec_Int_t *vInput,int nVars,Vec_Int_t *vMemory)

{
  int iVar1;
  uint uCube_00;
  uint *puVar2;
  int local_30;
  int i;
  uint uCube;
  Vec_Int_t *vMemory_local;
  int nVars_local;
  Vec_Int_t *vInput_local;
  Kit_Sop_t *cResult_local;
  
  cResult->nCubes = 0;
  iVar1 = Vec_IntSize(vInput);
  puVar2 = Vec_IntFetch(vMemory,iVar1);
  cResult->pCubes = puVar2;
  for (local_30 = 0; iVar1 = Vec_IntSize(vInput), local_30 < iVar1; local_30 = local_30 + 1) {
    uCube_00 = Vec_IntEntry(vInput,local_30);
    Kit_SopPushCube(cResult,uCube_00);
  }
  return;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Creates SOP from the cube array.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void Kit_SopCreate( Kit_Sop_t * cResult, Vec_Int_t * vInput, int nVars, Vec_Int_t * vMemory )
{
    unsigned uCube;
    int i;
    // start the cover
    cResult->nCubes = 0;
    cResult->pCubes = Vec_IntFetch( vMemory, Vec_IntSize(vInput) );
    // add the cubes
    Vec_IntForEachEntry( vInput, uCube, i )
        Kit_SopPushCube( cResult, uCube );
}